

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O3

floatx80 propagateFloatx80NaN_m68k(floatx80 a,floatx80 b,float_status *status)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  floatx80 fVar9;
  
  uVar2 = b._8_4_;
  uVar3 = b.low;
  uVar4 = a._8_4_;
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
      (~uVar4 & 0x7fff) != 0) {
    bVar5 = 2;
    if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
        (~uVar2 & 0x7fff) != 0) {
      uVar1 = -(ulong)(status->default_nan_mode != '\0') | uVar3;
      uVar4 = 0x7fff;
      if (status->default_nan_mode == '\0') {
        uVar4 = uVar2;
      }
      goto LAB_006beef0;
    }
LAB_006bee40:
    bVar7 = ((undefined1  [16])b & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0;
    bVar8 = ((undefined1  [16])b & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0;
    bVar6 = bVar5 == 5;
    if (bVar6 || bVar8 && bVar7) {
      bVar8 = !bVar6 || bVar8 && bVar7;
      goto LAB_006bee80;
    }
LAB_006beeb0:
    bVar6 = false;
    bVar8 = false;
  }
  else {
    bVar6 = ((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0;
    bVar7 = ((undefined1  [16])a & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0;
    if ((~uVar2 & 0x7fff) == 0 &&
        ((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
      bVar5 = (bVar7 && bVar6) | 4;
      goto LAB_006bee40;
    }
    bVar5 = 4;
    bVar8 = false;
    if (!bVar7 || !bVar6) goto LAB_006beeb0;
    bVar6 = true;
    bVar5 = 5;
LAB_006bee80:
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  if (status->default_nan_mode == '\0') {
    if (bVar5 < 4) {
      uVar1 = uVar3 | 0xc000000000000000;
      uVar4 = uVar2;
      if (!bVar8) {
        uVar1 = uVar3;
      }
    }
    else {
      uVar1 = a.low | 0xc000000000000000;
      if (!bVar6) {
        uVar1 = a.low;
      }
    }
  }
  else {
    uVar1 = 0xffffffffffffffff;
    uVar4 = (uint)CONCAT62(b._10_6_,0x7fff);
  }
LAB_006beef0:
  fVar9._8_4_ = uVar4;
  fVar9.low = uVar1;
  fVar9._12_4_ = 0;
  return fVar9;
}

Assistant:

floatx80 propagateFloatx80NaN(floatx80 a, floatx80 b, float_status *status)
{
    flag aIsLargerSignificand;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!floatx80_is_any_nan(a)
             ? float_class_normal
             : floatx80_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!floatx80_is_any_nan(b)
             ? float_class_normal
             : floatx80_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return floatx80_default_nan(status);
    }

    if (a.low < b.low) {
        aIsLargerSignificand = 0;
    } else if (b.low < a.low) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (a.high < b.high) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return floatx80_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return floatx80_silence_nan(a, status);
        }
        return a;
    }
}